

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O0

ps_seg_t * ps_seg_iter(ps_decoder_t *ps)

{
  ps_seg_t *itor;
  ps_decoder_t *ps_local;
  
  if (ps->search == (ps_search_t *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
            ,0x582,
            "No search module is selected, did you forget to specify a language model or grammar?\n"
           );
    ps_local = (ps_decoder_t *)0x0;
  }
  else {
    ptmr_start(&ps->perf);
    ps_local = (ps_decoder_t *)(*ps->search->vt->seg_iter)(ps->search);
    ptmr_stop(&ps->perf);
  }
  return (ps_seg_t *)ps_local;
}

Assistant:

ps_seg_t *
ps_seg_iter(ps_decoder_t *ps)
{
    ps_seg_t *itor;

    if (ps->search == NULL) {
        E_ERROR("No search module is selected, did you forget to "
                "specify a language model or grammar?\n");
        return NULL;
    }
    ptmr_start(&ps->perf);
    itor = ps_search_seg_iter(ps->search);
    ptmr_stop(&ps->perf);
    return itor;
}